

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O2

ostream * fizplex::operator<<(ostream *os,SVector *vec)

{
  pointer n;
  
  for (n = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
      n != (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish; n = n + 1) {
    operator<<(os,n);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SVector const &vec) {
  for (auto it = vec.cbegin(); it != vec.cend(); ++it) {
    os << *it;
  }
  return os;
}